

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

void av1_default_coef_probs(AV1_COMMON *cm)

{
  uint uVar1;
  FRAME_CONTEXT *pFVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  
  uVar1 = (cm->quant_params).base_qindex;
  if ((int)uVar1 < 0x15) {
    lVar10 = 0;
  }
  else {
    lVar10 = 1;
    if (0x3c < uVar1) {
      lVar10 = 3 - (ulong)(uVar1 < 0x79);
    }
  }
  memcpy(cm->fc,av1_default_txb_skip_cdfs + lVar10,0x186);
  memcpy(cm->fc->eob_extra_cdf,av1_default_eob_extra_cdfs + lVar10,0x21c);
  pFVar2 = cm->fc;
  uVar3 = *(undefined8 *)(av1_default_dc_sign_cdfs[lVar10][0][1] + 1);
  uVar4 = *(undefined8 *)(av1_default_dc_sign_cdfs[lVar10][0][2] + 2);
  uVar5 = *(undefined8 *)(av1_default_dc_sign_cdfs[lVar10][1] + 1);
  *(undefined8 *)pFVar2->dc_sign_cdf[0] = *(undefined8 *)av1_default_dc_sign_cdfs[lVar10][0];
  *(undefined8 *)(pFVar2->dc_sign_cdf[0][1] + 1) = uVar3;
  *(undefined8 *)(pFVar2->dc_sign_cdf[0][2] + 2) = uVar4;
  *(undefined8 *)(pFVar2->dc_sign_cdf[1] + 1) = uVar5;
  *(undefined4 *)(pFVar2->dc_sign_cdf[1][2] + 1) =
       *(undefined4 *)(av1_default_dc_sign_cdfs[lVar10][1][2] + 1);
  memcpy(cm->fc->coeff_br_cdf,av1_default_coeff_lps_multi_cdfs + lVar10,0x834);
  memcpy(cm->fc->coeff_base_cdf,av1_default_coeff_base_multi_cdfs + lVar10,0x1068);
  memcpy(cm->fc->coeff_base_eob_cdf,av1_default_coeff_base_eob_multi_cdfs + lVar10,0x140);
  pFVar2 = cm->fc;
  uVar3 = *(undefined8 *)(av1_default_eob_multi16_cdfs[lVar10][0][0] + 4);
  uVar4 = *(undefined8 *)(av1_default_eob_multi16_cdfs[lVar10][0][1] + 2);
  uVar5 = *(undefined8 *)av1_default_eob_multi16_cdfs[lVar10][1][0];
  uVar6 = *(undefined8 *)(av1_default_eob_multi16_cdfs[lVar10][1][0] + 4);
  uVar7 = *(undefined8 *)(av1_default_eob_multi16_cdfs[lVar10][1][1] + 2);
  *(undefined8 *)pFVar2->eob_flag_cdf16[0][0] =
       *(undefined8 *)av1_default_eob_multi16_cdfs[lVar10][0][0];
  *(undefined8 *)(pFVar2->eob_flag_cdf16[0][0] + 4) = uVar3;
  *(undefined8 *)(pFVar2->eob_flag_cdf16[0][1] + 2) = uVar4;
  *(undefined8 *)pFVar2->eob_flag_cdf16[1][0] = uVar5;
  *(undefined8 *)(pFVar2->eob_flag_cdf16[1][0] + 4) = uVar6;
  *(undefined8 *)(pFVar2->eob_flag_cdf16[1][1] + 2) = uVar7;
  pFVar2 = cm->fc;
  *(undefined8 *)(pFVar2->eob_flag_cdf32[1][1] + 3) =
       *(undefined8 *)(av1_default_eob_multi32_cdfs[lVar10][1][1] + 3);
  uVar3 = *(undefined8 *)av1_default_eob_multi32_cdfs[lVar10][0][0];
  uVar4 = *(undefined8 *)(av1_default_eob_multi32_cdfs[lVar10][0][0] + 4);
  uVar5 = *(undefined8 *)(av1_default_eob_multi32_cdfs[lVar10][0][1] + 1);
  uVar6 = *(undefined8 *)(av1_default_eob_multi32_cdfs[lVar10][0][1] + 5);
  uVar7 = *(undefined8 *)(av1_default_eob_multi32_cdfs[lVar10][1][0] + 6);
  *(undefined8 *)(pFVar2->eob_flag_cdf32[1][0] + 2) =
       *(undefined8 *)(av1_default_eob_multi32_cdfs[lVar10][1][0] + 2);
  *(undefined8 *)(pFVar2->eob_flag_cdf32[1][0] + 6) = uVar7;
  *(undefined8 *)(pFVar2->eob_flag_cdf32[0][1] + 1) = uVar5;
  *(undefined8 *)(pFVar2->eob_flag_cdf32[0][1] + 5) = uVar6;
  *(undefined8 *)pFVar2->eob_flag_cdf32[0][0] = uVar3;
  *(undefined8 *)(pFVar2->eob_flag_cdf32[0][0] + 4) = uVar4;
  pFVar2 = cm->fc;
  uVar3 = *(undefined8 *)(av1_default_eob_multi64_cdfs[lVar10][0][0] + 4);
  uVar4 = *(undefined8 *)av1_default_eob_multi64_cdfs[lVar10][0][1];
  uVar5 = *(undefined8 *)(av1_default_eob_multi64_cdfs[lVar10][0][1] + 4);
  uVar6 = *(undefined8 *)av1_default_eob_multi64_cdfs[lVar10][1][0];
  uVar7 = *(undefined8 *)(av1_default_eob_multi64_cdfs[lVar10][1][0] + 4);
  uVar8 = *(undefined8 *)av1_default_eob_multi64_cdfs[lVar10][1][1];
  uVar9 = *(undefined8 *)(av1_default_eob_multi64_cdfs[lVar10][1][1] + 4);
  *(undefined8 *)pFVar2->eob_flag_cdf64[0][0] =
       *(undefined8 *)av1_default_eob_multi64_cdfs[lVar10][0][0];
  *(undefined8 *)(pFVar2->eob_flag_cdf64[0][0] + 4) = uVar3;
  *(undefined8 *)pFVar2->eob_flag_cdf64[0][1] = uVar4;
  *(undefined8 *)(pFVar2->eob_flag_cdf64[0][1] + 4) = uVar5;
  *(undefined8 *)pFVar2->eob_flag_cdf64[1][0] = uVar6;
  *(undefined8 *)(pFVar2->eob_flag_cdf64[1][0] + 4) = uVar7;
  *(undefined8 *)pFVar2->eob_flag_cdf64[1][1] = uVar8;
  *(undefined8 *)(pFVar2->eob_flag_cdf64[1][1] + 4) = uVar9;
  memcpy(cm->fc->eob_flag_cdf128,av1_default_eob_multi128_cdfs + lVar10,0x48);
  memcpy(cm->fc->eob_flag_cdf256,av1_default_eob_multi256_cdfs + lVar10,0x50);
  memcpy(cm->fc->eob_flag_cdf512,av1_default_eob_multi512_cdfs + lVar10,0x58);
  memcpy(cm->fc->eob_flag_cdf1024,av1_default_eob_multi1024_cdfs + lVar10,0x60);
  return;
}

Assistant:

void av1_default_coef_probs(AV1_COMMON *cm) {
  const int index = get_q_ctx(cm->quant_params.base_qindex);
#if CONFIG_ENTROPY_STATS
  cm->coef_cdf_category = index;
#endif

  av1_copy(cm->fc->txb_skip_cdf, av1_default_txb_skip_cdfs[index]);
  av1_copy(cm->fc->eob_extra_cdf, av1_default_eob_extra_cdfs[index]);
  av1_copy(cm->fc->dc_sign_cdf, av1_default_dc_sign_cdfs[index]);
  av1_copy(cm->fc->coeff_br_cdf, av1_default_coeff_lps_multi_cdfs[index]);
  av1_copy(cm->fc->coeff_base_cdf, av1_default_coeff_base_multi_cdfs[index]);
  av1_copy(cm->fc->coeff_base_eob_cdf,
           av1_default_coeff_base_eob_multi_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf16, av1_default_eob_multi16_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf32, av1_default_eob_multi32_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf64, av1_default_eob_multi64_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf128, av1_default_eob_multi128_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf256, av1_default_eob_multi256_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf512, av1_default_eob_multi512_cdfs[index]);
  av1_copy(cm->fc->eob_flag_cdf1024, av1_default_eob_multi1024_cdfs[index]);
}